

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O1

void __thiscall
axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr
          (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *this,BufHdr *hdr)

{
  int32_t *piVar1;
  BufHdr *pBVar2;
  FreeFunc *pFVar3;
  
  if (this->m_hdr != hdr) {
    if (hdr != (BufHdr *)0x0) {
      LOCK();
      piVar1 = &(hdr->super_RefCount).m_refCount;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    pBVar2 = this->m_hdr;
    if (pBVar2 != (BufHdr *)0x0) {
      LOCK();
      piVar1 = &(pBVar2->super_RefCount).m_refCount;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        (**(pBVar2->super_RefCount)._vptr_RefCount)(pBVar2);
        LOCK();
        piVar1 = &(pBVar2->super_RefCount).m_weakRefCount;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if ((*piVar1 == 0) &&
           (pFVar3 = (pBVar2->super_RefCount).m_freeFunc, pFVar3 != (FreeFunc *)0x0)) {
          (*pFVar3)(pBVar2);
        }
      }
    }
    this->m_hdr = hdr;
  }
  return;
}

Assistant:

void
	attachBufHdr(rc::BufHdr* hdr) const {
		if (hdr == m_hdr)
			return; // try to avoid unnecessary interlocked ops

		if (hdr)
			hdr->addRef();

		if (m_hdr)
			m_hdr->release();

		m_hdr = hdr;
	}